

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extract_cpio_bz2.c
# Opt level: O2

void test_extract_cpio_bz2(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_extract.cpio.bz2");
  wVar1 = systemf("%s -it < %s >test.out 2>test.err",testprog,"test_extract.cpio.bz2");
  if (wVar1 != L'\0') {
    wVar1 = canBzip2();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
                     ,L'\x1b');
      test_skipping("It seems bzip2 is not supported on this platform");
      return;
    }
  }
  wVar1 = systemf("%s -i < %s >test.out 2>test.err",testprog,"test_extract.cpio.bz2");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
                      ,L'\x12',0,"0",(long)wVar1,
                      "systemf(\"%s -i < %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0)
  ;
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
             ,L'\x14',"file1");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
             ,L'\x15',"contents of file1.\n","file1");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
             ,L'\x16',"file2");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
             ,L'\x17',"contents of file2.\n","file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
             ,L'\x18',"test.out");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_bz2.c"
             ,L'\x19',"1 block\n","test.err");
  return;
}

Assistant:

DEFINE_TEST(test_extract_cpio_bz2)
{
	const char *reffile = "test_extract.cpio.bz2";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s -it < %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canBzip2()) {
		assertEqualInt(0, systemf("%s -i < %s >test.out 2>test.err",
		    testprog, reffile));

		assertFileExists("file1");
		assertTextFileContents("contents of file1.\n", "file1");
		assertFileExists("file2");
		assertTextFileContents("contents of file2.\n", "file2");
		assertEmptyFile("test.out");
		assertTextFileContents("1 block\n", "test.err");
	} else {
		skipping("It seems bzip2 is not supported on this platform");
	}
}